

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_imm_ea(m68k_info *info,int opcode,uint8_t size,int imm)

{
  m68k_info *info_00;
  int in_ECX;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  m68k_info *in_stack_ffffffffffffffe0;
  
  info_00 = (m68k_info *)
            build_init_op(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                          (int)in_stack_ffffffffffffffd8,
                          (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  (info_00->extension).operands[0].field_0.simm = 2.8026e-45;
  (info_00->extension).operands[0].field_0.reg_pair.reg_1 = M68K_REG_FP1;
  info_00->code = (uint8_t *)(long)in_ECX;
  get_ea_mode_op(info_00,(cs_m68k_op *)&(info_00->extension).operands[0].mem,
                 (uint)((ulong)info_00 >> 0x20),(uint)info_00);
  return;
}

Assistant:

static void build_imm_ea(m68k_info *info, int opcode, uint8_t size, int imm)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->type = M68K_OP_IMM;
	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->imm = imm;

	get_ea_mode_op(info, op1, info->ir, size);
}